

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void gl4cts::CopyImage::Utils::makeTextureComplete
               (Context *context,GLenum target,GLuint id,GLint base_level,GLint max_level)

{
  int iVar1;
  GLenum GVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  Functions *gl;
  GLint max_level_local;
  GLint base_level_local;
  GLuint id_local;
  GLenum target_local;
  Context *context_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext(context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  if (target != 0x8d41) {
    GVar2 = transProxyToRealTarget(target);
    GVar2 = transRealToBindTarget(GVar2);
    (**(code **)(lVar5 + 0xb8))(GVar2,id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x554);
    if (GVar2 != 0x8c2a) {
      (**(code **)(lVar5 + 0x1360))(GVar2,0x813c,base_level);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"TexParameteri",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                      ,0x55a);
      (**(code **)(lVar5 + 0x1360))(GVar2,0x813d,max_level);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"TexParameteri",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                      ,0x55d);
      if ((GVar2 != 0x9100) && (GVar2 != 0x9102)) {
        (**(code **)(lVar5 + 0x1360))(GVar2,0x2800,0x2600);
        if (GVar2 == 0x84f5) {
          (**(code **)(lVar5 + 0x1360))(0x84f5,0x2801,0x2600);
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"TexParameteri",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                          ,0x570);
        }
        else {
          (**(code **)(lVar5 + 0x1360))(GVar2,0x2801,0x2700);
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"TexParameteri",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                          ,0x56b);
        }
      }
    }
    (**(code **)(lVar5 + 0xb8))(GVar2,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                    ,0x577);
  }
  return;
}

Assistant:

void Utils::makeTextureComplete(deqp::Context& context, GLenum target, GLuint id, GLint base_level, GLint max_level)
{
	const Functions& gl = context.getRenderContext().getFunctions();

	if (GL_RENDERBUFFER == target)
	{
		return;
	}

	/* Translate proxies into real targets */
	target = transRealToBindTarget(transProxyToRealTarget(target));

	gl.bindTexture(target, id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* Set levels */
	if (GL_TEXTURE_BUFFER != target)
	{
		gl.texParameteri(target, GL_TEXTURE_BASE_LEVEL, base_level);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

		gl.texParameteri(target, GL_TEXTURE_MAX_LEVEL, max_level);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

		/* Integer textures won't be complete with the default min filter
		 * of GL_NEAREST_MIPMAP_LINEAR (or GL_LINEAR for rectangle textures)
		 * and default mag filter of GL_LINEAR, so switch to nearest.
		 */
		if (GL_TEXTURE_2D_MULTISAMPLE != target &&
			GL_TEXTURE_2D_MULTISAMPLE_ARRAY != target)
		{
			gl.texParameteri(target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			if (GL_TEXTURE_RECTANGLE != target)
			{
				gl.texParameteri(target, GL_TEXTURE_MIN_FILTER,
								 GL_NEAREST_MIPMAP_NEAREST);
				GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");
			}
			else
			{
				gl.texParameteri(target, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");
			}
		}
	}

	/* Clean binding point */
	gl.bindTexture(target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
}